

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AStateProvider_A_CheckForReload
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  AWeapon *this;
  PClass *pPVar4;
  undefined8 uVar5;
  PClass *pPVar6;
  FState *val;
  int iVar7;
  int iVar8;
  char *pcVar9;
  bool bVar10;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (0 < numparam) {
    if (((param->field_0).field_3.Type != '\x03') ||
       (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_003d779d:
      pcVar9 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_003d77c8;
    }
    puVar2 = (undefined8 *)(param->field_0).field_1.a;
    if (puVar2 != (undefined8 *)0x0) {
      if (puVar2[1] == 0) {
        uVar5 = (**(code **)*puVar2)(puVar2);
        puVar2[1] = uVar5;
      }
      pPVar6 = (PClass *)puVar2[1];
      bVar10 = pPVar6 != (PClass *)0x0;
      if (pPVar6 != pPVar4 && bVar10) {
        do {
          pPVar6 = pPVar6->ParentClass;
          bVar10 = pPVar6 != (PClass *)0x0;
          if (pPVar6 == pPVar4) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if (!bVar10) {
        pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003d77c8;
      }
    }
    pPVar4 = AStateProvider::RegistrationInfo.MyClass;
    if (numparam != 1) {
      if ((param[1].field_0.field_3.Type != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_003d779d;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar5 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar5;
        }
        pPVar6 = (PClass *)puVar3[1];
        bVar10 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar4 && bVar10) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar10 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar4) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar10) {
          pcVar9 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))";
          goto LAB_003d77c8;
        }
      }
      if (2 < numparam) {
        if (param[2].field_0.field_3.Type == '\x03') {
          if ((puVar2[0x46] == 0) || (*(long *)(puVar2[0x46] + 0xd0) == 0)) {
            if (numret < 1) {
              iVar7 = 0;
            }
            else {
              if (ret == (VMReturn *)0x0) {
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x1172,
                              "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              VMReturn::SetPointer(ret,(void *)0x0,0);
              iVar7 = 1;
            }
            return iVar7;
          }
          if (numparam == 3) {
            pcVar9 = "(paramnum) < numparam";
          }
          else {
            if (param[3].field_0.field_3.Type == '\0') {
              if (numparam < 5) {
                pcVar9 = "(paramnum) < numparam";
              }
              else {
                if (param[4].field_0.field_3.Type == '\0') {
                  iVar7 = param[3].field_0.i;
                  iVar1 = param[4].field_0.i;
                  if (puVar3[1] == 0) {
                    uVar5 = (**(code **)*puVar3)(puVar3);
                    puVar3[1] = uVar5;
                  }
                  val = FStateLabelStorage::GetState
                                  (&StateLabels,iVar1,(PClassActor *)puVar3[1],false);
                  if (numparam == 5) {
                    param = defaultparam->Array;
                    if (param[5].field_0.field_3.Type != '\0') {
                      pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d7856:
                      __assert_fail(pcVar9,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                    ,0x1176,
                                    "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                  }
                  else if (param[5].field_0.field_3.Type != '\0') {
                    pcVar9 = "(param[paramnum]).Type == REGT_INT";
                    goto LAB_003d7856;
                  }
                  iVar1 = param[5].field_0.i;
                  if (0 < numret) {
                    VMReturn::SetPointer(ret,(void *)0x0,0);
                    numret = 1;
                  }
                  this = *(AWeapon **)(puVar2[0x46] + 0xd0);
                  if ((iVar1 == 0) || (iVar8 = 1, this->ReloadCounter != 0)) {
                    iVar8 = (this->ReloadCounter + 1) % iVar7;
                  }
                  if (iVar8 == 0) {
                    AWeapon::CheckAmmo(this,0,false,false,-1);
                  }
                  else if (numret != 0) {
                    VMReturn::SetPointer(ret,val,0);
                  }
                  if (iVar1 != 0) {
                    return numret;
                  }
                  this->ReloadCounter = iVar8;
                  return numret;
                }
                pcVar9 = "param[paramnum].Type == REGT_INT";
              }
              __assert_fail(pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x1175,
                            "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar9 = "param[paramnum].Type == REGT_INT";
          }
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1174,
                        "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar9 = "param[paramnum].Type == REGT_POINTER";
        goto LAB_003d77c8;
      }
    }
  }
  pcVar9 = "(paramnum) < numparam";
LAB_003d77c8:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x116e,
                "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_CheckForReload)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);

	if ( self->player == NULL || self->player->ReadyWeapon == NULL )
	{
		ACTION_RETURN_STATE(NULL);
	}
	PARAM_INT		(count);
	PARAM_STATE_ACTION	(jump);
	PARAM_BOOL_DEF	(dontincrement);

	if (numret > 0)
	{
		ret->SetPointer(NULL, ATAG_STATE);
		numret = 1;
	}

	AWeapon *weapon = self->player->ReadyWeapon;

	int ReloadCounter = weapon->ReloadCounter;
	if (!dontincrement || ReloadCounter != 0)
		ReloadCounter = (weapon->ReloadCounter+1) % count;
	else // 0 % 1 = 1?  So how do we check if the weapon was never fired?  We should only do this when we're not incrementing the counter though.
		ReloadCounter = 1;

	// If we have not made our last shot...
	if (ReloadCounter != 0)
	{
		// Go back to the refire frames, instead of continuing on to the reload frames.
		if (numret != 0)
		{
			ret->SetPointer(jump, ATAG_STATE);
		}
	}
	else
	{
		// We need to reload. However, don't reload if we're out of ammo.
		weapon->CheckAmmo(false, false);
	}
	if (!dontincrement)
	{
		weapon->ReloadCounter = ReloadCounter;
	}
	return numret;
}